

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O2

void helics::addOperations(Translator *trans,TranslatorTypes type)

{
  shared_ptr<helics::TranslatorOperations> *psVar1;
  shared_ptr<helics::JsonTranslatorOperation> operation;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<helics::TranslatorOperations> local_38;
  shared_ptr<helics::TranslatorOperations> local_28;
  
  if (type == BINARY) {
    std::make_shared<helics::BinaryTranslatorOperation>();
    psVar1 = &local_38;
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Translator::setTranslatorOperations(trans,&local_38);
  }
  else {
    if (type != JSON) {
      return;
    }
    std::make_shared<helics::JsonTranslatorOperation>();
    psVar1 = &local_28;
    local_28.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Translator::setTranslatorOperations(trans,&local_28);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(psVar1->super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>)
              ._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return;
}

Assistant:

void addOperations(Translator* trans, TranslatorTypes type)
{
    switch (type) {
        case TranslatorTypes::CUSTOM:
        default:
            break;
        case TranslatorTypes::JSON: {
            auto operation = std::make_shared<JsonTranslatorOperation>();
            trans->setTranslatorOperations(std::move(operation));
        } break;
        case TranslatorTypes::BINARY: {
            auto operation = std::make_shared<BinaryTranslatorOperation>();
            trans->setTranslatorOperations(std::move(operation));
        } break;
    }
}